

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O2

int json_array_clear(json_t *json)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = -1;
  if ((json != (json_t *)0x0) && (iVar1 = -1, json->type == JSON_ARRAY)) {
    for (uVar2 = 0; uVar2 < json[1].refcount; uVar2 = uVar2 + 1) {
      json_decref(*(json_t **)(*(long *)(json + 2) + uVar2 * 8));
    }
    json[1].refcount = 0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int json_array_clear(json_t *json)
{
	json_array_t *array;
	size_t i;

	if (!json_is_array(json))
		return -1;
	array = json_to_array(json);

	for (i = 0; i < array->entries; i++)
		json_decref(array->table[i]);

	array->entries = 0;
	return 0;
}